

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O1

Literal * __thiscall
Shell::AnswerLiteralManager::getAnswerLiteral
          (AnswerLiteralManager *this,VList *vars,SList *srts,Formula *f)

{
  undefined1 *puVar1;
  Symbol *this_00;
  TermList TVar2;
  bool bVar3;
  uint uVar4;
  OperatorKey *key;
  OperatorType *type;
  Literal *pLVar5;
  uint arity;
  ulong uVar6;
  TermList sort;
  TermList local_60;
  Stack<Kernel::TermList> local_58;
  
  if (getAnswerLiteral(Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*,Kernel::Formula*)::
      litArgs == '\0') {
    getAnswerLiteral();
  }
  getAnswerLiteral::litArgs._cursor = getAnswerLiteral::litArgs._stack;
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  if (vars != (VList *)0x0) {
    do {
      uVar4 = vars->_head;
      vars = vars->_tail;
      local_60._content = 2;
      if (srts == (SList *)0x0) {
        bVar3 = Kernel::SortHelper::tryGetVariableSort(uVar4,f,&local_60);
        if (!bVar3) {
          local_60 = Kernel::AtomicSort::defaultSort();
        }
      }
      else {
        local_60._content = (srts->_head)._content;
        srts = srts->_tail;
      }
      if (getAnswerLiteral::litArgs._cursor == getAnswerLiteral::litArgs._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&getAnswerLiteral::litArgs);
      }
      TVar2._content = local_60._content;
      (getAnswerLiteral::litArgs._cursor)->_content = (ulong)(uVar4 * 4 + 1);
      getAnswerLiteral::litArgs._cursor = getAnswerLiteral::litArgs._cursor + 1;
      if (local_58._cursor == local_58._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&local_58);
      }
      (local_58._cursor)->_content = TVar2._content;
      local_58._cursor = local_58._cursor + 1;
    } while (vars != (List<unsigned_int> *)0x0);
  }
  arity = (uint)((ulong)((long)getAnswerLiteral::litArgs._cursor -
                        (long)getAnswerLiteral::litArgs._stack) >> 3);
  uVar4 = Kernel::Signature::addFreshPredicate(DAT_00b7e1b0,arity,"ans",(char *)0x0);
  this_00 = (DAT_00b7e1b0->_preds)._stack[uVar4];
  uVar6 = (ulong)((long)local_58._cursor - (long)local_58._stack) >> 3;
  key = Kernel::OperatorType::setupKey((uint)uVar6,local_58._stack);
  *(undefined8 *)(key + (uVar6 & 0xffffffff) * 8 + 8) = 2;
  type = Kernel::OperatorType::getTypeFromKey(key,0);
  Kernel::Signature::Symbol::setType(this_00,type);
  puVar1 = &this_00->field_0x40;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x40408;
  pLVar5 = Kernel::Literal::create(uVar4,arity,true,getAnswerLiteral::litArgs._stack);
  if (local_58._stack != (TermList *)0x0) {
    uVar6 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
    }
    else if (uVar6 < 0x11) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
    }
    else if (uVar6 < 0x19) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
    }
    else if (uVar6 < 0x21) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
    }
    else if (uVar6 < 0x31) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
    }
    else if (uVar6 < 0x41) {
      (local_58._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
    }
    else {
      operator_delete(local_58._stack,0x10);
    }
  }
  return pLVar5;
}

Assistant:

Literal* AnswerLiteralManager::getAnswerLiteral(VList* vars,SList* srts,Formula* f)
{
  static Stack<TermList> litArgs;
  litArgs.reset();
  TermStack sorts;
  while(VList::isNonEmpty(vars)) {
    unsigned var = vars->head();
    vars = vars->tail();
    TermList sort;
    if (SList::isNonEmpty(srts)) {
      sort = srts->head();
      srts = srts->tail();
    } else if(!SortHelper::tryGetVariableSort(var, f, sort)) {
      sort = AtomicSort::defaultSort();
    }
    litArgs.push(TermList(var, false));
    sorts.push(sort);
  }

  unsigned vcnt = litArgs.size();
  unsigned pred = env.signature->addFreshPredicate(vcnt,"ans");
  Signature::Symbol* predSym = env.signature->getPredicate(pred);
  predSym->setType(OperatorType::getPredicateType(sorts.size(), sorts.begin()));
  predSym->markAnswerPredicate();
  // don't need equality proxy for answer literals
  predSym->markSkipCongruence();
  return Literal::create(pred, vcnt, true, litArgs.begin());
}